

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::AsyncifyLocals::create(AsyncifyLocals *this)

{
  long in_RSI;
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>_>
  local_20 [2];
  AsyncifyLocals *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::AsyncifyLocals,wasm::(anonymous_namespace)::ModuleAnalyzer*&,wasm::Type&,wasm::Name&>
            ((ModuleAnalyzer **)local_20,(Type *)(in_RSI + 0x130),(Name *)(in_RSI + 0x138));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AsyncifyLocals>(
      analyzer, pointerType, asyncifyMemory);
  }